

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int decode(jpeg *j,huffman *h)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = j->code_bits;
  if (iVar4 < 0x10) {
    grow_buffer_unsafe(j);
    iVar4 = j->code_bits;
  }
  uVar1 = j->code_buffer;
  cVar2 = (char)iVar4;
  uVar5 = (ulong)h->fast[uVar1 >> (cVar2 - 9U & 0x1f) & 0x1ff];
  if (uVar5 == 0xff) {
    uVar3 = uVar1 >> ((byte)(iVar4 + -0x10) & 0x1f);
    if (iVar4 < 0x10) {
      uVar3 = uVar1 << (0x10U - cVar2 & 0x1f);
    }
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6 + 1;
    } while (h->maxcode[lVar6 + 10] <= (uVar3 & 0xffff));
    if (lVar7 == 8) {
      j->code_bits = iVar4 + -0x10;
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = 0xffffffff;
      if ((int)lVar6 + 10 <= iVar4) {
        lVar7 = (ulong)(iVar4 - 9) - lVar7;
        iVar4 = (uVar1 >> ((byte)lVar7 & 0x1f) & bmask[lVar6 + 10]) + h->delta[lVar6 + 10];
        if ((uVar1 >> (cVar2 - h->size[iVar4] & 0x1f) & bmask[h->size[iVar4]]) !=
            (uint)h->code[iVar4]) {
          __assert_fail("(((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                        ,0x2e7,"int decode(jpeg *, huffman *)");
        }
        j->code_bits = (int)lVar7;
        uVar3 = (uint)h->values[iVar4];
      }
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((int)(uint)h->size[uVar5] <= iVar4) {
      j->code_bits = iVar4 - (uint)h->size[uVar5];
      uVar3 = (uint)h->values[uVar5];
    }
  }
  return uVar3;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}